

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick.h
# Opt level: O1

void __thiscall entityx::EntityX::EntityX(EntityX *this)

{
  entityx::EventManager::EventManager(&this->events);
  entityx::EntityManager::EntityManager(&this->entities,&this->events);
  (this->systems).initialized_ = false;
  (this->systems).entity_manager_ = &this->entities;
  (this->systems).event_manager_ = &this->events;
  (this->systems).systems_._M_h._M_buckets = &(this->systems).systems_._M_h._M_single_bucket;
  (this->systems).systems_._M_h._M_bucket_count = 1;
  (this->systems).systems_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->systems).systems_._M_h._M_element_count = 0;
  (this->systems).systems_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->systems).systems_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->systems).systems_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

EntityX() : entities(events), systems(entities, events) {}